

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O1

void __thiscall unixsocketipc::MessageReceiver::~MessageReceiver(MessageReceiver *this)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  
  this->_vptr_MessageReceiver = (_func_int **)&PTR__MessageReceiver_00104da8;
  if (this->server_socket_fd != 0) {
    close(this->server_socket_fd);
  }
  unlink((this->socket_filename)._M_dataplus._M_p);
  if (this->message_buf != (char *)0x0) {
    operator_delete__(this->message_buf);
  }
  this->message_buf = (char *)0x0;
  pcVar1 = (this->socket_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->socket_filename).field_2) {
    operator_delete(pcVar1);
  }
  p_Var2 = (this->on_client_connected).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->on_client_connected,(_Any_data *)&this->on_client_connected,
              __destroy_functor);
  }
  p_Var2 = (this->callback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  return;
}

Assistant:

MessageReceiver::~MessageReceiver() {
   // close the socket
   if (server_socket_fd)
      ::close(server_socket_fd);

   // remove socket file
   unlink(socket_filename.c_str());

   // get rid of the buffer
   delete[] message_buf;
   message_buf = nullptr;
}